

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O0

void __thiscall
tlog::Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (Logger *this,uint64_t current,uint64_t total,
          duration<long,_std::ratio<1L,_1000000L>_> duration)

{
  bool bVar1;
  size_type sVar2;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> _Var3;
  __shared_ptr_access<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  shared_ptr<tlog::IOutput> *output;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
  *__range2;
  duration_t dur;
  uint64_t total_local;
  uint64_t current_local;
  Logger *this_local;
  duration<long,_std::ratio<1L,_1000000L>_> duration_local;
  
  dur.__r._4_4_ = 6;
  this_local = (Logger *)duration.__r;
  sVar2 = std::set<tlog::ESeverity,_std::less<tlog::ESeverity>,_std::allocator<tlog::ESeverity>_>::
          count(&this->mHiddenSeverities,(key_type *)((long)&dur.__r + 4));
  if (sVar2 == 0) {
    _Var3 = std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000l>>
                      ((duration<long,_std::ratio<1L,_1000000L>_> *)&this_local);
    __end2 = std::
             set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
             ::begin(&this->mOutputs);
    output = (shared_ptr<tlog::IOutput> *)
             std::
             set<std::shared_ptr<tlog::IOutput>,_std::less<std::shared_ptr<tlog::IOutput>_>,_std::allocator<std::shared_ptr<tlog::IOutput>_>_>
             ::end(&this->mOutputs);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&output), bVar1) {
      this_00 = (__shared_ptr_access<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<tlog::IOutput>_>::operator*(&__end2);
      peVar4 = std::__shared_ptr_access<tlog::IOutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar4->_vptr_IOutput[1])(peVar4,&this->mScope,current,total,_Var3.__r);
      std::_Rb_tree_const_iterator<std::shared_ptr<tlog::IOutput>_>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void progress(uint64_t current, uint64_t total, T duration) {
            if (mHiddenSeverities.count(ESeverity::Progress)) {
                return;
            }

            duration_t dur = std::chrono::duration_cast<duration_t>(duration);
            for (auto& output : mOutputs) {
                output->writeProgress(mScope, current, total, dur);
            }
        }